

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

void __thiscall covenant::CFG::stats(CFG *this,ostream *o)

{
  pointer pvVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  poVar2 = std::operator<<(o,"Number of terminals        : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->alphsz);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(o,"Number of non-terminals    : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  pvVar1 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar7 = 0;
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)(((long)(this->prods).
                             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
      uVar3 = uVar3 + 1) {
    uVar6 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&pvVar1[uVar4].
                                          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                          *(long *)&pvVar1[uVar4].
                                    super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                    ._M_impl.super__Vector_impl_data) >> 2);
    uVar7 = uVar7 + uVar6;
    if (uVar6 < uVar5) {
      uVar6 = uVar5;
    }
    uVar5 = uVar6;
  }
  poVar2 = std::operator<<(o,"Total number of productions: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  if ((this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar2 = std::operator<<(o,"Avg number of productions per non-terminal : ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(float)uVar7 /
                               (float)(ulong)(((long)(this->prods).
                                                                                                          
                                                  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->prods).
                                                                                                        
                                                  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)
                       );
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(o,"Max number of productions per non-terminal : ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    return;
  }
  return;
}

Assistant:

void stats(ostream &o) const
    {
      o << "Number of terminals        : " << alphsz << "\n";
      o << "Number of non-terminals    : " << prods.size () << "\n";

      unsigned total_productions=0;
      unsigned max_per_nonterminal=0;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        total_productions += prods[vv].size();
        max_per_nonterminal = std::max(max_per_nonterminal, 
                                       (unsigned) prods[vv].size ());
      }

      o << "Total number of productions: " << total_productions << "\n";
      if (prods.size() > 0)
      {
        o << "Avg number of productions per non-terminal : " 
          << float(total_productions) / float(prods.size ()) << "\n";
        o << "Max number of productions per non-terminal : " 
          << max_per_nonterminal << "\n";
      }
    }